

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SievingPrimes.cpp
# Opt level: O0

void __thiscall
primesieve::SievingPrimes::SievingPrimes
          (SievingPrimes *this,Erat *erat,uint64_t sieveSize,MemoryPool *memoryPool)

{
  EVP_PKEY_CTX *in_RSI;
  SievingPrimes *in_RDI;
  Erat *in_stack_ffffffffffffffc0;
  
  Erat::Erat(in_stack_ffffffffffffffc0);
  in_RDI->i_ = 0;
  in_RDI->size_ = 0;
  in_RDI->low_ = 0;
  in_RDI->tinyIdx_ = 0;
  in_RDI->sieveIdx_ = 0xffffffffffffffff;
  Vector<bool,_std::allocator<bool>_>::Vector(&in_RDI->tinySieve_);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

SievingPrimes::SievingPrimes(Erat* erat,
                             uint64_t sieveSize,
                             MemoryPool& memoryPool)
{
  init(erat, sieveSize, memoryPool);
}